

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::BackUp(CopyingOutputStreamAdaptor *this,int count)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  LogMessage *pLVar4;
  LogMessage local_88;
  Voidify local_71;
  Nullable<const_char_*> local_70;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  Voidify local_51;
  Nullable<const_char_*> local_50;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_38;
  Voidify local_21;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  CopyingOutputStreamAdaptor *pCStack_10;
  int count_local;
  CopyingOutputStreamAdaptor *this_local;
  
  absl_log_internal_check_op_result._4_4_ = count;
  pCStack_10 = this;
  if (count == 0) {
    Flush(this);
  }
  else {
    iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue(count);
    iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
    local_20 = absl::lts_20250127::log_internal::Check_GEImpl(iVar1,iVar2,"count >= 0");
    if (local_20 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_20);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0x145,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_38);
    }
    iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue(this->buffer_used_);
    iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(this->buffer_size_);
    local_50 = absl::lts_20250127::log_internal::Check_EQImpl
                         (iVar1,iVar2,"buffer_used_ == buffer_size_");
    if (local_50 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_50);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&absl_log_internal_check_op_result_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0x146,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                         ((LogMessage *)&absl_log_internal_check_op_result_2);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar4,(char (*) [43])" BackUp() can only be called after Next().");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&absl_log_internal_check_op_result_2);
    }
    iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue
                      (absl_log_internal_check_op_result._4_4_);
    iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(this->buffer_used_);
    local_70 = absl::lts_20250127::log_internal::Check_LEImpl(iVar1,iVar2,"count <= buffer_used_");
    if (local_70 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_70);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0x148,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_88);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar4,(char (*) [78])
                                 " Can\'t back up over more bytes than were returned by the last call to Next()."
                         );
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_71,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_88);
    }
    this->buffer_used_ = this->buffer_used_ - absl_log_internal_check_op_result._4_4_;
  }
  return;
}

Assistant:

void CopyingOutputStreamAdaptor::BackUp(int count) {
  if (count == 0) {
    Flush();
    return;
  }
  ABSL_CHECK_GE(count, 0);
  ABSL_CHECK_EQ(buffer_used_, buffer_size_)
      << " BackUp() can only be called after Next().";
  ABSL_CHECK_LE(count, buffer_used_)
      << " Can't back up over more bytes than were returned by the last call"
         " to Next().";

  buffer_used_ -= count;
}